

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::ActivateMorphWeapon(APlayerPawn *this)

{
  bool bVar1;
  PClassActor *type;
  DPSprite *pDVar2;
  AWeapon *this_00;
  FState *state;
  player_t *ppVar3;
  FName local_24;
  
  type = PClass::FindActor(&local_24);
  ppVar3 = (this->super_AActor).player;
  ppVar3->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  if (ppVar3->ReadyWeapon != (AWeapon *)0x0) {
    pDVar2 = player_t::GetPSprite(ppVar3,PSP_WEAPON);
    pDVar2->y = 32.0;
  }
  if (type == (PClassActor *)0x0) {
    ppVar3 = (this->super_AActor).player;
  }
  else {
    bVar1 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,&type->super_PClass);
    ppVar3 = (this->super_AActor).player;
    if (bVar1) {
      this_00 = (AWeapon *)AActor::FindInventory(&ppVar3->mo->super_AActor,type,false);
      ppVar3 = (this->super_AActor).player;
      ppVar3->ReadyWeapon = this_00;
      if (this_00 == (AWeapon *)0x0) {
        this_00 = (AWeapon *)AActor::GiveInventoryType(&ppVar3->mo->super_AActor,type);
        ppVar3 = (this->super_AActor).player;
        ppVar3->ReadyWeapon = this_00;
        if (this_00 == (AWeapon *)0x0) goto LAB_00463c16;
        this_00->GivenAsMorphWeapon = true;
      }
      state = AWeapon::GetReadyState(this_00);
      P_SetPsprite(ppVar3,PSP_WEAPON,state,false);
      ppVar3 = (this->super_AActor).player;
      if (ppVar3->ReadyWeapon != (AWeapon *)0x0) {
        P_SetPsprite(ppVar3,PSP_FLASH,(FState *)0x0,false);
        ppVar3 = (this->super_AActor).player;
      }
      goto LAB_00463c16;
    }
  }
  ppVar3->ReadyWeapon = (AWeapon *)0x0;
LAB_00463c16:
  ppVar3->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  return;
}

Assistant:

void APlayerPawn::ActivateMorphWeapon ()
{
	PClassActor *morphweapon = PClass::FindActor (MorphWeapon);
	player->PendingWeapon = WP_NOCHANGE;

	if (player->ReadyWeapon != nullptr)
	{
		player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
	}

	if (morphweapon == nullptr || !morphweapon->IsDescendantOf (RUNTIME_CLASS(AWeapon)))
	{ // No weapon at all while morphed!
		player->ReadyWeapon = nullptr;
	}
	else
	{
		player->ReadyWeapon = static_cast<AWeapon *>(player->mo->FindInventory (morphweapon));
		if (player->ReadyWeapon == nullptr)
		{
			player->ReadyWeapon = static_cast<AWeapon *>(player->mo->GiveInventoryType (morphweapon));
			if (player->ReadyWeapon != nullptr)
			{
				player->ReadyWeapon->GivenAsMorphWeapon = true; // flag is used only by new beastweap semantics in P_UndoPlayerMorph
			}
		}
		if (player->ReadyWeapon != nullptr)
		{
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
	}

	if (player->ReadyWeapon != nullptr)
	{
		P_SetPsprite(player, PSP_FLASH, nullptr);
	}

	player->PendingWeapon = WP_NOCHANGE;
}